

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O2

string * __thiscall
absl::lts_20240722::FormatTime_abi_cxx11_
          (string *__return_storage_ptr__,lts_20240722 *this,string_view format,Time t,TimeZone tz)

{
  char *__s;
  undefined4 in_register_0000008c;
  cctz_parts parts;
  allocator<char> local_69;
  basic_string_view<char,_std::char_traits<char>_> local_68;
  allocator<char> local_58 [32];
  undefined8 local_38;
  char *local_30;
  long local_28;
  
  local_30 = format._M_str;
  local_68._M_str = (char *)format._M_len;
  local_68._M_len = (size_t)this;
  if (t.rep_.rep_hi_.lo_ == 0xffffffff && local_30 == (char *)0x7fffffffffffffff) {
    __s = "infinite-future";
  }
  else {
    if (local_30 != (char *)0x8000000000000000 || t.rep_.rep_hi_.lo_ != 0xffffffff) {
      local_28 = ((ulong)t.rep_.rep_hi_ & 0xffffffff) * 250000;
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((string *)local_58,&local_68,&local_69);
      local_38 = CONCAT44(in_register_0000008c,t.rep_.rep_lo_);
      absl::lts_20240722::time_internal::cctz::detail::format
                ((string *)__return_storage_ptr__,(time_point *)local_58,(duration *)&local_30,
                 (time_zone *)&local_28);
      std::__cxx11::string::~string((string *)local_58);
      return __return_storage_ptr__;
    }
    __s = "infinite-past";
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,local_58);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatTime(absl::string_view format, absl::Time t,
                       absl::TimeZone tz) {
  if (t == absl::InfiniteFuture()) return std::string(kInfiniteFutureStr);
  if (t == absl::InfinitePast()) return std::string(kInfinitePastStr);
  const auto parts = Split(t);
  return cctz::detail::format(std::string(format), parts.sec, parts.fem,
                              cctz::time_zone(tz));
}